

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Dot<3>::doExpand(Dot<3> *this,ExpandContext *param_1,ArgExprs *args)

{
  undefined8 in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *pSVar1;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<float> EVar2;
  ExprP<float> local_a0;
  ExprP<float> local_90;
  ExprP<float> local_80;
  ExprP<float> local_70;
  int local_60;
  int ndx;
  ExprP<float> local_50;
  ExprP<float> local_40;
  undefined1 local_29;
  undefined8 local_28;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  Dot<3> *this_local;
  ExprP<float> *val;
  
  local_29 = 0;
  local_28 = in_RCX;
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_40,(int)in_RCX);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_50,(int)local_28 + 0x10);
  shaderexecutor::operator*((shaderexecutor *)this,&local_40,&local_50);
  ExprP<float>::~ExprP(&local_50);
  ExprP<float>::~ExprP(&local_40);
  pSVar1 = extraout_RDX;
  for (local_60 = 1; local_60 < 3; local_60 = local_60 + 1) {
    ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
              ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_90,(int)local_28);
    ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
              ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_a0,(int)local_28 + 0x10);
    shaderexecutor::operator*((shaderexecutor *)&local_80,&local_90,&local_a0);
    shaderexecutor::operator+((shaderexecutor *)&local_70,(ExprP<float> *)this,&local_80);
    ExprP<float>::operator=((ExprP<float> *)this,&local_70);
    ExprP<float>::~ExprP(&local_70);
    ExprP<float>::~ExprP(&local_80);
    ExprP<float>::~ExprP(&local_a0);
    ExprP<float>::~ExprP(&local_90);
    pSVar1 = extraout_RDX_00;
  }
  EVar2.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       pSVar1;
  EVar2.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar2.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<float>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		ExprP<float> val = args.a[0] * args.b[0];

		for (int ndx = 1; ndx < Size; ++ndx)
			val = val + args.a[ndx] * args.b[ndx];

		return val;
	}